

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O0

int __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::close
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,int __fd)

{
  int extraout_EAX;
  service_type *psVar1;
  implementation_type *piVar2;
  error_code ec;
  error_code *in_stack_ffffffffffffffd0;
  reactive_socket_service_base *this_00;
  
  CLI::std::error_code::error_code(in_stack_ffffffffffffffd0);
  psVar1 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_service(&this->impl_);
  this_00 = (reactive_socket_service_base *)&psVar1->super_reactive_socket_service_base;
  piVar2 = asio::detail::
           io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
           ::get_implementation(&this->impl_);
  asio::detail::reactive_socket_service_base::close(this_00,(int)piVar2);
  asio::detail::throw_error((error_code *)this_00,(char *)this);
  return extraout_EAX;
}

Assistant:

void close()
  {
    asio::error_code ec;
    impl_.get_service().close(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "close");
  }